

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O2

JSValue js_std_file_getline(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  undefined1 auVar1 [16];
  int iVar2;
  FILE *__stream;
  ulong uVar3;
  JSValue JVar4;
  JSValue JVar5;
  ulong uStack_50;
  DynBuf dbuf;
  
  __stream = (FILE *)js_std_file_get(ctx,this_val);
  if (__stream == (FILE *)0x0) {
    uStack_50 = 6;
LAB_0010dd25:
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uStack_50;
    JVar4 = (JSValue)(auVar1 << 0x40);
    uVar3 = 0;
  }
  else {
    js_std_dbuf_init(ctx,&dbuf);
    do {
      iVar2 = fgetc(__stream);
      if (iVar2 == 10) {
LAB_0010dd48:
        JVar4 = JS_NewStringLen(ctx,(char *)dbuf.buf,dbuf.size);
        dbuf_free(&dbuf);
        uVar3 = (ulong)JVar4.u.ptr & 0xffffffff00000000;
        goto LAB_0010dd71;
      }
      if (iVar2 == -1) {
        if (dbuf.size != 0) goto LAB_0010dd48;
        dbuf_free(&dbuf);
        uStack_50 = 2;
        goto LAB_0010dd25;
      }
      iVar2 = dbuf_putc(&dbuf,(uint8_t)iVar2);
    } while (iVar2 == 0);
    dbuf_free(&dbuf);
    JVar4 = JS_ThrowOutOfMemory(ctx);
    uVar3 = (ulong)JVar4.u.ptr & 0xffffffff00000000;
  }
LAB_0010dd71:
  JVar5.u.ptr = (void *)((ulong)JVar4.u.ptr & 0xffffffff | uVar3);
  JVar5.tag = JVar4.tag;
  return JVar5;
}

Assistant:

static JSValue js_std_file_getline(JSContext *ctx, JSValueConst this_val,
                                   int argc, JSValueConst *argv)
{
    FILE *f = js_std_file_get(ctx, this_val);
    int c;
    DynBuf dbuf;
    JSValue obj;
    
    if (!f)
        return JS_EXCEPTION;

    js_std_dbuf_init(ctx, &dbuf);
    for(;;) {
        c = fgetc(f);
        if (c == EOF) {
            if (dbuf.size == 0) {
                /* EOF */
                dbuf_free(&dbuf);
                return JS_NULL;
            } else {
                break;
            }
        }
        if (c == '\n')
            break;
        if (dbuf_putc(&dbuf, c)) {
            dbuf_free(&dbuf);
            return JS_ThrowOutOfMemory(ctx);
        }
    }
    obj = JS_NewStringLen(ctx, (const char *)dbuf.buf, dbuf.size);
    dbuf_free(&dbuf);
    return obj;
}